

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzero.cpp
# Opt level: O2

Machine * putStructure(Machine *__return_storage_ptr__,Machine *m,Register r,Functor *f)

{
  mapped_type *pmVar1;
  Hcell *pHVar2;
  mapped_type *this;
  Functor local_88;
  undefined1 local_60 [48];
  key_type local_30;
  key_type local_2c [2];
  Register r_local;
  
  local_2c[0].r = r.r;
  Hcell::str((Hcell *)local_60,(Hix)((m->h).hix + 1));
  pmVar1 = std::map<Hix,_Hcell,_std::less<Hix>,_std::allocator<std::pair<const_Hix,_Hcell>_>_>::
           operator[](&m->heap,&m->h);
  pHVar2 = Hcell::operator=(pmVar1,(Hcell *)local_60);
  this = std::
         map<Register,_Hcell,_std::less<Register>,_std::allocator<std::pair<const_Register,_Hcell>_>_>
         ::operator[](&m->regval,local_2c);
  Hcell::operator=(this,pHVar2);
  std::__cxx11::string::~string((string *)(local_60 + 8));
  Functor::Functor(&local_88,f);
  Hcell::functor((Hcell *)local_60,&local_88);
  local_30.hix = (m->h).hix + 1;
  pmVar1 = std::map<Hix,_Hcell,_std::less<Hix>,_std::allocator<std::pair<const_Hix,_Hcell>_>_>::
           operator[](&m->heap,&local_30);
  Hcell::operator=(pmVar1,(Hcell *)local_60);
  std::__cxx11::string::~string((string *)(local_60 + 8));
  std::__cxx11::string::~string((string *)&local_88);
  (m->h).hix = (m->h).hix + 2;
  Machine::Machine(__return_storage_ptr__,m);
  return __return_storage_ptr__;
}

Assistant:

Machine putStructure(Machine m, Register r, Functor f) {
    m.regval[r] = m.heap[m.h] = Hcell::str(m.h + 1);
    m.heap[m.h + 1] = Hcell::functor(f);
    m.h += 2;
    return m;
}